

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

uint32 __thiscall
Js::HeapArgumentsObject::GetNextFormalArgIndex
          (HeapArgumentsObject *this,uint32 index,BOOL enumNonEnumerable,
          PropertyAttributes *attributes)

{
  BOOLEAN BVar1;
  uint uVar2;
  uint i;
  uint32 uVar3;
  
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  i = index + 1;
  uVar2 = this->formalCount;
  uVar3 = 0xffffffff;
  if ((i < uVar2) && (uVar3 = i, (this->deletedArgs).ptr != (BVSparse<Memory::Recycler> *)0x0)) {
    while ((uVar3 = 0xffffffff, i < uVar2 &&
           (BVar1 = BVSparse<Memory::Recycler>::Test((this->deletedArgs).ptr,i), uVar3 = i,
           BVar1 != '\0'))) {
      i = i + 1;
      uVar2 = this->formalCount;
    }
  }
  return uVar3;
}

Assistant:

uint32 HeapArgumentsObject::GetNextFormalArgIndex(uint32 index, BOOL enumNonEnumerable, PropertyAttributes* attributes) const
    {
        if (attributes != nullptr)
        {
            *attributes = PropertyEnumerable;
        }

        if ( ++index < formalCount )
        {
            // None of the arguments deleted
            if ( deletedArgs == nullptr )
            {
                return index;
            }

            while ( index < formalCount )
            {
                if (!this->deletedArgs->Test(index))
                {
                    return index;
                }

                index++;
            }
        }

        return JavascriptArray::InvalidIndex;
    }